

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O3

void __thiscall miniminer_tests::miniminer_negative::test_method(miniminer_negative *this)

{
  uchar *puVar1;
  CTxMemPool *this_00;
  element_type *peVar2;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar3;
  CTxMemPoolEntry **ppCVar4;
  int64_t iVar5;
  CAmount CVar6;
  const_iterator cVar7;
  lazy_ostream *assertion_descr;
  char *pcVar8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  initializer_list<COutPoint> __l_01;
  const_string file_03;
  optional<CFeeRate> target_feerate;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  CFeeRate feerate_zero;
  CTransactionRef tx_mod_negative;
  CAmount negative_fee_delta;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> template_txids;
  MiniMiner mini_miner_no_target;
  MiniMiner mini_miner_target0;
  check_type cVar11;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined4 local_5c4;
  size_t local_5c0;
  undefined1 local_5b8 [16];
  undefined1 *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  CFeeRate local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  CTransactionRef local_4b0;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  CAmount local_470;
  TestMemPoolEntryHelper local_468;
  undefined4 *local_420;
  _Rb_tree_node_base local_418;
  size_t *local_3f8;
  _Rb_tree_node_base local_3f0;
  char *local_3d0;
  char *local_3c8;
  assertion_result local_3c0;
  unique_lock<std::recursive_mutex> local_3a8;
  unique_lock<std::recursive_mutex> local_398;
  undefined1 local_388 [8];
  element_type *peStack_380;
  shared_count sStack_378;
  _Base_ptr local_370;
  uint32_t local_368;
  size_t local_360;
  undefined1 local_358 [8];
  element_type *peStack_350;
  shared_count sStack_348;
  _Base_ptr local_340;
  uint32_t local_338;
  _Base_ptr local_330;
  _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
  local_320;
  _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  local_2f0;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_2c0;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_290;
  _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
  local_250;
  pointer local_220;
  pointer local_210;
  _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
  local_208;
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [8];
  undefined1 local_1c8 [16];
  uint32_t local_1b8;
  undefined1 local_1a0 [48];
  _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  local_170;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_140;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_110;
  _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
  local_d0;
  pointer local_a0;
  pointer local_90;
  _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
  local_88;
  pointer local_58;
  element_type *peStack_50;
  pointer local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar8 = "m_node.mempool";
  puVar3 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                      ,0x4d,"test_method","m_node.mempool");
  this_00 = (puVar3->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  local_398._M_device = &cs_main.super_recursive_mutex;
  local_398._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_398);
  local_3a8._M_device = &(this_00->cs).super_recursive_mutex;
  local_3a8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_3a8);
  local_468.nFee = 0;
  local_468.time.__d.__r = (duration)0;
  local_468.nHeight = 1;
  local_468.m_sequence = 0;
  local_468.spendsCoinbase = false;
  local_468.sigOpCost = 4;
  local_468.lp.height = 0;
  local_468.lp.time = 0;
  local_468.lp.maxInputBlock = (CBlockIndex *)0x0;
  local_470 = -50000;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x55;
  file.m_begin = (iterator)&local_480;
  msg.m_end = in_R9;
  msg.m_begin = pcVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_490,msg);
  local_358[0] = (readonly_property<bool>)(class_property<bool>)0x1;
  peStack_350 = (element_type *)0x0;
  sStack_348.pi_ = (sp_counted_base *)0x0;
  local_1c8._8_8_ = local_388;
  local_388 = (undefined1  [8])0xeaa474;
  peStack_380 = (element_type *)0xeaa48e;
  auStack_1d0 = (undefined1  [8])((ulong)auStack_1d0 & 0xffffffffffffff00);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_1c8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_498 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_358,(lazy_ostream *)local_1d8,1,0,WARN,_cVar11,
             (size_t)&local_4a0,0x55);
  boost::detail::shared_count::~shared_count(&sStack_348);
  peVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8 = *(undefined1 (*) [8])&(peVar2->hash).m_wrapped;
  auStack_1d0 = *(undefined1 (*) [8])((long)&peVar2->hash + 8);
  puVar1 = (uchar *)((long)&peVar2->hash + 0x10);
  local_1c8[0] = puVar1[0];
  local_1c8[1] = puVar1[1];
  local_1c8[2] = puVar1[2];
  local_1c8[3] = puVar1[3];
  local_1c8[4] = puVar1[4];
  local_1c8[5] = puVar1[5];
  local_1c8[6] = puVar1[6];
  local_1c8[7] = puVar1[7];
  local_1c8._8_8_ = *(undefined8 *)((long)&peVar2->hash + 0x18);
  local_1b8 = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_1d8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_358,__l,
             (allocator_type *)local_388);
  make_tx((miniminer_tests *)&local_4b0,(vector<COutPoint,_std::allocator<COutPoint>_> *)local_358,1
         );
  if (local_358 != (undefined1  [8])0x0) {
    operator_delete((void *)local_358,(long)sStack_348.pi_ - (long)local_358);
  }
  local_468.nFee = 1000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_1d8,&local_468,&local_4b0);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_1d8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_1a0 + 8));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_1c8);
  if (auStack_1d0 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1d0);
  }
  CTxMemPool::PrioritiseTransaction
            (this_00,&((local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped,&local_470);
  local_358 = *(undefined1 (*) [8])
               ((local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  peStack_350 = *(element_type **)
                 (((local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  sStack_348.pi_ =
       *(sp_counted_base **)
        (((local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  local_340 = *(_Base_ptr *)
               (((local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_338 = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_358;
  local_58 = (pointer)local_358;
  peStack_50 = peStack_350;
  local_48 = (pointer)sStack_348.pi_;
  p_Stack_40 = local_340;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_388,__l_00,
             (allocator_type *)&local_3f0);
  ::node::MiniMiner::MiniMiner
            ((MiniMiner *)local_1d8,this_00,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_388);
  if (local_388 != (undefined1  [8])0x0) {
    operator_delete((void *)local_388,(long)sStack_378.pi_ - (long)local_388);
  }
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5d;
  file_00.m_begin = (iterator)&local_4c0;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4d0,
             msg_00);
  local_388[0] = local_1d8[0];
  peStack_380 = (element_type *)0x0;
  sStack_378.pi_ = (sp_counted_base *)0x0;
  local_3f0._0_8_ = "mini_miner_target0.IsReadyToCalculate()";
  local_3f0._M_parent = (_Base_ptr)0xeaa4b6;
  peStack_350 = (element_type *)((ulong)peStack_350 & 0xffffffffffffff00);
  local_358 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_348.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_4d8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_340 = &local_3f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_388,(lazy_ostream *)local_358,1,0,WARN,_cVar11,
             (size_t)&local_4e0,0x5d);
  boost::detail::shared_count::~shared_count(&sStack_378);
  local_4e8.nSatoshisPerK = 0;
  ::node::MiniMiner::BuildMockTemplate
            ((MiniMiner *)local_1d8,(optional<CFeeRate>)(ZEXT816(1) << 0x40));
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x61;
  file_01.m_begin = (iterator)&local_4f8;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_508,
             msg_01);
  local_418._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(local_4b0.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  ppCVar4 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                      ((CTxMemPoolEntry **)&local_418,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                       ,0x61,"test_method","pool.GetEntry(tx_mod_negative->GetHash())");
  iVar5 = GetVirtualTransactionSize
                    ((long)(*ppCVar4)->nTxWeight,(*ppCVar4)->sigOpCost,nBytesPerSigOp);
  CVar6 = CFeeRate::GetFee(&local_4e8,(uint32_t)iVar5);
  local_388[0] = (class_property<bool>)(class_property<bool>)(-49000 < CVar6);
  peStack_380 = (element_type *)0x0;
  sStack_378.pi_ = (sp_counted_base *)0x0;
  local_3f0._0_8_ =
       "negative_modified_fees < feerate_zero.GetFee(inline_assertion_check<true>(pool.GetEntry(tx_mod_negative->GetHash()), \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp\", 97, __func__, \"pool.GetEntry(tx_mod_negative->GetHash())\")->GetTxSize())"
  ;
  local_3f0._M_parent = (_Base_ptr)0xeaa603;
  peStack_350 = (element_type *)((ulong)peStack_350 & 0xffffffffffffff00);
  local_358 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_348.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_510 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_340 = &local_3f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_388,(lazy_ostream *)local_358,1,0,WARN,_cVar11,
             (size_t)&local_518,0x61);
  boost::detail::shared_count::~shared_count(&sStack_378);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x62;
  file_02.m_begin = (iterator)&local_528;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_538,
             msg_02);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
              *)local_358,&local_110);
  local_3f0._M_color._0_1_ = local_330 == (_Base_ptr)0x0;
  local_3f0._M_parent = (_Base_ptr)0x0;
  local_3f0._M_left = (_Base_ptr)0x0;
  local_418._0_8_ = "mini_miner_target0.GetMockTemplateTxids().empty()";
  local_418._M_parent = (_Base_ptr)0xeaa635;
  peStack_380 = (element_type *)((ulong)peStack_380 & 0xffffffffffffff00);
  local_388 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_378.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_540 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_370 = &local_418;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3f0,(lazy_ostream *)local_388,1,0,WARN,_cVar11,
             (size_t)&local_548,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&local_3f0._M_left);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)local_358);
  sStack_378.pi_ = (sp_counted_base *)local_48;
  local_370 = p_Stack_40;
  local_388 = (undefined1  [8])local_58;
  peStack_380 = peStack_50;
  local_368 = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_388;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&local_3f0,__l_01,
             (allocator_type *)&local_418);
  ::node::MiniMiner::MiniMiner
            ((MiniMiner *)local_358,this_00,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&local_3f0);
  if ((pointer)local_3f0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f0._0_8_,(long)local_3f0._M_left - local_3f0._0_8_);
  }
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x66;
  file_03.m_begin = (iterator)&local_558;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_568,
             msg_03);
  local_3f0._M_color._0_1_ = local_358[0];
  local_3f0._M_parent = (_Base_ptr)0x0;
  local_3f0._M_left = (_Base_ptr)0x0;
  local_418._0_8_ = "mini_miner_no_target.IsReadyToCalculate()";
  local_418._M_parent = (_Base_ptr)0xeaa65f;
  assertion_descr = (lazy_ostream *)local_388;
  peStack_380 = (element_type *)((ulong)peStack_380 & 0xffffffffffffff00);
  local_388 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_378.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_570 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_370 = &local_418;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3f0,assertion_descr,1,0,WARN,_cVar11,(size_t)&local_578,0x66
            );
  boost::detail::shared_count::~shared_count((shared_count *)&local_3f0._M_left);
  target_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = 0;
  target_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)assertion_descr;
  ::node::MiniMiner::BuildMockTemplate((MiniMiner *)local_358,target_feerate);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
              *)local_388,&local_290);
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x69;
  file_04.m_begin = (iterator)&local_588;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_598,
             msg_04);
  local_5b8._8_8_ = local_5b8._8_8_ & 0xffffffffffffff00;
  local_5b8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_5a8 = boost::unit_test::lazy_ostream::inst;
  local_5a0 = "";
  local_3f8 = &local_5c0;
  local_5c0 = local_360;
  local_420 = &local_5c4;
  local_3c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_360 == 1);
  local_5c4 = 1;
  local_3c0.m_message.px = (element_type *)0x0;
  local_3c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_3c8 = "";
  local_3f0._M_right = (_Base_ptr)&local_3f8;
  local_3f0._M_parent = (_Base_ptr)((ulong)local_3f0._M_parent & 0xffffffffffffff00);
  local_3f0._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_3f0._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_418._M_right = (_Base_ptr)&local_420;
  local_418._M_parent = (_Base_ptr)((ulong)local_418._M_parent & 0xffffffffffffff00);
  local_418._0_8_ = &PTR__lazy_ostream_013ae248;
  local_418._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  pcVar8 = "template_txids.size()";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_3c0,(lazy_ostream *)local_5b8,1,2,REQUIRE,0xeaa660,(size_t)&local_3d0,0x69,
             (assertion_result *)&local_3f0,"1",&local_418);
  boost::detail::shared_count::~shared_count(&local_3c0.m_message.pn);
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x6a;
  file_05.m_begin = (iterator)&local_5d8;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5e8,
             msg_05);
  cVar7 = std::
          _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
          ::find((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                  *)local_388,
                 &((local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped);
  local_418._M_color._0_1_ = cVar7._M_node != (_Base_ptr)&peStack_380;
  local_418._M_parent = (_Base_ptr)0x0;
  local_418._M_left = (_Base_ptr)0x0;
  local_5b8._0_8_ = "template_txids.count(tx_mod_negative->GetHash().ToUint256()) > 0";
  local_5b8._8_8_ = "";
  local_3f0._M_parent = (_Base_ptr)((ulong)local_3f0._M_parent & 0xffffffffffffff00);
  local_3f0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_3f0._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_5f0 = "";
  local_3f0._M_right = (_Base_ptr)local_5b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_418,(lazy_ostream *)&local_3f0,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_5f8,0x6a);
  boost::detail::shared_count::~shared_count((shared_count *)&local_418._M_left);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)local_388);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
  ::~_Rb_tree(&local_208);
  if (local_220 != (pointer)0x0) {
    operator_delete(local_220,(long)local_210 - (long)local_220);
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
  ::~_Rb_tree(&local_250);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_290);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  ::~_Rb_tree(&local_2c0);
  std::
  _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_2f0);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
  ::~_Rb_tree(&local_320);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)&peStack_350);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
  ::~_Rb_tree(&local_88);
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0,(long)local_90 - (long)local_a0);
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
  ::~_Rb_tree(&local_d0);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_110);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  ::~_Rb_tree(&local_140);
  std::
  _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_170);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
               *)local_1a0);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)auStack_1d0);
  if (local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_3a8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_398);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_negative, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create a transaction that will be prioritised to have a negative modified fee.
    const CAmount positive_base_fee{1000};
    const CAmount negative_fee_delta{-50000};
    const CAmount negative_modified_fees{positive_base_fee + negative_fee_delta};
    BOOST_CHECK(negative_modified_fees < 0);
    const auto tx_mod_negative = make_tx({COutPoint{m_coinbase_txns[4]->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(positive_base_fee).FromTx(tx_mod_negative));
    pool.PrioritiseTransaction(tx_mod_negative->GetHash(), negative_fee_delta);
    const COutPoint only_outpoint{tx_mod_negative->GetHash(), 0};

    // When target feerate is 0, transactions with negative fees are not selected.
    node::MiniMiner mini_miner_target0(pool, {only_outpoint});
    BOOST_CHECK(mini_miner_target0.IsReadyToCalculate());
    const CFeeRate feerate_zero(0);
    mini_miner_target0.BuildMockTemplate(feerate_zero);
    // Check the quit condition:
    BOOST_CHECK(negative_modified_fees < feerate_zero.GetFee(Assert(pool.GetEntry(tx_mod_negative->GetHash()))->GetTxSize()));
    BOOST_CHECK(mini_miner_target0.GetMockTemplateTxids().empty());

    // With no target feerate, the template includes all transactions, even negative feerate ones.
    node::MiniMiner mini_miner_no_target(pool, {only_outpoint});
    BOOST_CHECK(mini_miner_no_target.IsReadyToCalculate());
    mini_miner_no_target.BuildMockTemplate(std::nullopt);
    const auto template_txids{mini_miner_no_target.GetMockTemplateTxids()};
    BOOST_CHECK_EQUAL(template_txids.size(), 1);
    BOOST_CHECK(template_txids.count(tx_mod_negative->GetHash().ToUint256()) > 0);
}